

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::WriteCheckpoint(cmCTestMultiProcessHandler *this,int index)

{
  ostream *poVar1;
  string fname;
  ofstream fout;
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)&fout,this->CTest);
  std::operator+(&fname,(string *)&fout,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&fout);
  std::ofstream::ofstream(&fout);
  std::ofstream::open((char *)&fout,(_Ios_Openmode)fname._M_dataplus._M_p);
  poVar1 = (ostream *)std::ostream::operator<<(&fout,index);
  std::operator<<(poVar1,"\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::WriteCheckpoint(int index)
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  cmsys::ofstream fout;
  fout.open(fname.c_str(), std::ios::app);
  fout << index << "\n";
  fout.close();
}